

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubsumptionDemodulationHelper.hpp
# Opt level: O2

TermList __thiscall Inferences::OverlayBinder::apply(OverlayBinder *this,Var var)

{
  TermList result;
  TermList local_10;
  
  local_10._content = 2;
  tryGetBinding(this,var,&local_10);
  return (TermList)local_10._content;
}

Assistant:

TermList apply(Var var) const
    {
      TermList result;
      if (tryGetBinding(var, result)) {
        return result;
      } else {
        // We should never access unbound variables
        // (NOTE: we should not return the variable itself here, as this creates a risk of mixing variables coming from different clauses)
        ASSERTION_VIOLATION;
      }
    }